

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_control_impl.cc
# Opt level: O0

void __thiscall
webrtc::GainControlImpl::Initialize
          (GainControlImpl *this,size_t num_proc_channels,int sample_rate_hz)

{
  Mode mode;
  int minimum_capture_level;
  int maximum_capture_level;
  bool bVar1;
  unsigned_long *puVar2;
  unique_ptr *this_00;
  GainController *this_01;
  pointer this_02;
  int *piVar3;
  unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
  *gain_controller;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>
  *__range1;
  Optional<int> local_58;
  Optional<unsigned_long> local_50 [2];
  CritScope local_30;
  CritScope cs_capture;
  CritScope cs_render;
  size_t sStack_18;
  int sample_rate_hz_local;
  size_t num_proc_channels_local;
  GainControlImpl *this_local;
  
  cs_render.cs_._4_4_ = sample_rate_hz;
  sStack_18 = num_proc_channels;
  num_proc_channels_local = (size_t)this;
  rtc::CritScope::CritScope(&cs_capture,this->crit_render_);
  rtc::CritScope::CritScope(&local_30,this->crit_capture_);
  rtc::Optional<unsigned_long>::Optional(local_50,&stack0xffffffffffffffe8);
  (this->num_proc_channels_).has_value_ = local_50[0].has_value_;
  (this->num_proc_channels_).value_ = local_50[0].value_;
  rtc::Optional<int>::Optional(&local_58,(int *)((long)&cs_render.cs_ + 4));
  (this->sample_rate_hz_).value_ = local_58.value_;
  (this->sample_rate_hz_).has_value_ = local_58.has_value_;
  if ((this->enabled_ & 1U) != 0) {
    puVar2 = rtc::Optional<unsigned_long>::operator*(&this->num_proc_channels_);
    std::
    vector<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>
    ::resize(&this->gain_controllers_,*puVar2);
    __end1 = std::
             vector<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>
             ::begin(&this->gain_controllers_);
    gain_controller =
         (unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
          *)std::
            vector<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>
            ::end(&this->gain_controllers_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_*,_std::vector<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>_>
                                       *)&gain_controller), bVar1) {
      this_00 = (unique_ptr *)
                __gnu_cxx::
                __normal_iterator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_*,_std::vector<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>_>
                ::operator*(&__end1);
      bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
      if (!bVar1) {
        this_01 = (GainController *)operator_new(0x10);
        GainController::GainController(this_01);
        std::
        unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
        ::reset((unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
                 *)this_00,this_01);
      }
      this_02 = std::
                unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
                ::operator->((unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>
                              *)this_00);
      mode = this->mode_;
      minimum_capture_level = this->minimum_capture_level_;
      maximum_capture_level = this->maximum_capture_level_;
      piVar3 = rtc::Optional<int>::operator*(&this->sample_rate_hz_);
      GainController::Initialize
                (this_02,minimum_capture_level,maximum_capture_level,mode,*piVar3,
                 this->analog_capture_level_);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_*,_std::vector<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>,_std::allocator<std::unique_ptr<webrtc::GainControlImpl::GainController,_std::default_delete<webrtc::GainControlImpl::GainController>_>_>_>_>
      ::operator++(&__end1);
    }
    Configure(this);
    AllocateRenderQueue(this);
  }
  rtc::CritScope::~CritScope(&local_30);
  rtc::CritScope::~CritScope(&cs_capture);
  return;
}

Assistant:

void GainControlImpl::Initialize(size_t num_proc_channels, int sample_rate_hz) {
  rtc::CritScope cs_render(crit_render_);
  rtc::CritScope cs_capture(crit_capture_);

  num_proc_channels_ = rtc::Optional<size_t>(num_proc_channels);
  sample_rate_hz_ = rtc::Optional<int>(sample_rate_hz);

  if (!enabled_) {
    return;
  }

  gain_controllers_.resize(*num_proc_channels_);
  for (auto& gain_controller : gain_controllers_) {
    if (!gain_controller) {
      gain_controller.reset(new GainController());
    }
    gain_controller->Initialize(minimum_capture_level_, maximum_capture_level_,
                                mode_, *sample_rate_hz_, analog_capture_level_);
  }

  Configure();

  AllocateRenderQueue();
}